

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeFactory.cpp
# Opt level: O3

QString * ExeFactory::getTypeName(exe_type type)

{
  mapped_type *ppEVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  int in_ESI;
  EVP_PKEY_CTX *in_RDI;
  QByteArrayView QVar4;
  key_type local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  init(in_RDI);
  if (builders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &builders._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = builders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (in_ESI <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < in_ESI];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != &builders._M_t._M_impl.super__Rb_tree_header) &&
       ((int)p_Var2[1]._M_color <= in_ESI)) {
      ppEVar1 = std::
                map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
                ::operator[](&builders,&local_3c);
      if (*ppEVar1 != (mapped_type)0x0) {
        (*(*ppEVar1)->_vptr_ExeBuilder[4])();
        return (QString *)in_RDI;
      }
    }
  }
  QVar4.m_data = (storage_type *)0xd;
  QVar4.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar4);
  *(undefined8 *)in_RDI = local_38;
  *(undefined8 *)(in_RDI + 8) = uStack_30;
  *(undefined8 *)(in_RDI + 0x10) = local_28;
  return (QString *)in_RDI;
}

Assistant:

QString ExeFactory::getTypeName(exe_type type)
{
    ExeFactory::init(); //ensue that the builders are initialized

    if (builders.find(type) == builders.end()) return "Not supported";

    ExeBuilder* builder = builders[type];
    if (builder == NULL) return "Not supported";

    return builder->typeName();
}